

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O1

BitMatrix *
ZXing::Deflate(BitMatrix *__return_storage_ptr__,BitMatrix *input,int width,int height,float top,
              float left,float subSampling)

{
  pointer puVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  BitMatrix::BitMatrix(__return_storage_ptr__,width,height);
  if (0 < __return_storage_ptr__->_height) {
    iVar5 = 0;
    do {
      if (0 < __return_storage_ptr__->_width) {
        lVar4 = 0;
        do {
          bVar2 = BitMatrix::get(input,(int)((float)(int)lVar4 * subSampling + left),
                                 (int)((float)iVar5 * subSampling + top));
          if (bVar2) {
            lVar3 = (long)(__return_storage_ptr__->_width * iVar5);
            puVar1 = (__return_storage_ptr__->_bits).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(__return_storage_ptr__->_bits).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <=
                (ulong)(lVar4 + lVar3)) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            puVar1[lVar4 + lVar3] = 0xff;
          }
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 < __return_storage_ptr__->_width);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < __return_storage_ptr__->_height);
  }
  return __return_storage_ptr__;
}

Assistant:

BitMatrix Deflate(const BitMatrix& input, int width, int height, float top, float left, float subSampling)
{
	BitMatrix result(width, height);

	for (int y = 0; y < result.height(); y++) {
		auto yOffset = top + y * subSampling;
		for (int x = 0; x < result.width(); x++) {
			if (input.get(PointF(left + x * subSampling, yOffset)))
				result.set(x, y);
		}
	}

	return result;
}